

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_slot_allocator_free(ma_slot_allocator *pAllocator,ma_uint64 slot)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ma_uint32 newBitfield;
  ma_uint32 oldBitfield;
  ma_uint32 iBit;
  ma_uint32 iGroup;
  ma_uint64 slot_local;
  ma_slot_allocator *pAllocator_local;
  uint local_10;
  ma_uint32 cap;
  
  if (pAllocator == (ma_slot_allocator *)0x0) {
    pAllocator_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    uVar4 = (slot & 0xffffffff) >> 5;
    uVar2 = (uint)slot & 0x1f;
    local_10 = pAllocator->capacity >> 5;
    if ((pAllocator->capacity & 0x1f) != 0) {
      local_10 = local_10 + 1;
    }
    if ((uint)uVar4 < local_10) {
      if (0x1f < uVar2) {
        __assert_fail("iBit < 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x1587,"ma_result ma_slot_allocator_free(ma_slot_allocator *, ma_uint64)");
      }
      do {
        if (pAllocator->count == 0) {
          return MA_INVALID_OPERATION;
        }
        uVar1 = pAllocator->pGroups[uVar4].bitfield;
        LOCK();
        uVar3 = pAllocator->pGroups[uVar4].bitfield;
        if (uVar1 == uVar3) {
          pAllocator->pGroups[uVar4].bitfield = uVar1 & ~(1 << uVar2);
          uVar3 = uVar1;
        }
        UNLOCK();
      } while (uVar3 != uVar1);
      LOCK();
      pAllocator->count = pAllocator->count - 1;
      UNLOCK();
      pAllocator_local._4_4_ = MA_SUCCESS;
    }
    else {
      pAllocator_local._4_4_ = MA_INVALID_ARGS;
    }
  }
  return pAllocator_local._4_4_;
}

Assistant:

MA_API ma_result ma_slot_allocator_free(ma_slot_allocator* pAllocator, ma_uint64 slot)
{
    ma_uint32 iGroup;
    ma_uint32 iBit;

    if (pAllocator == NULL) {
        return MA_INVALID_ARGS;
    }

    iGroup = (ma_uint32)((slot & 0xFFFFFFFF) >> 5);   /* slot / 32 */
    iBit   = (ma_uint32)((slot & 0xFFFFFFFF) & 31);   /* slot % 32 */

    if (iGroup >= ma_slot_allocator_group_capacity(pAllocator)) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(iBit < 32);   /* This must be true due to the logic we used to actually calculate it. */

    while (c89atomic_load_32(&pAllocator->count) > 0) {
        /* CAS */
        ma_uint32 oldBitfield;
        ma_uint32 newBitfield;

        oldBitfield = c89atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */
        newBitfield = oldBitfield & ~(1 << iBit);

        /* Debugging for checking for double-frees. */
        #if defined(MA_DEBUG_OUTPUT)
        {
            if ((oldBitfield & (1 << iBit)) == 0) {
                MA_ASSERT(MA_FALSE);    /* Double free detected.*/
            }
        }
        #endif

        if (c89atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
            c89atomic_fetch_sub_32(&pAllocator->count, 1);
            return MA_SUCCESS;
        }
    }

    /* Getting here means there are no allocations available for freeing. */
    return MA_INVALID_OPERATION;
}